

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddValueError
          (OptionInterpreter *this,
          FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          make_error)

{
  string_view element_name;
  
  element_name._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
  element_name._M_len = (this->options_to_interpret_->element_name)._M_string_length;
  AddError(this->builder_,element_name,&this->uninterpreted_option_->super_Message,OPTION_VALUE,
           make_error);
  return false;
}

Assistant:

bool AddValueError(absl::FunctionRef<std::string()> make_error) {
      return AddOptionError(DescriptorPool::ErrorCollector::OPTION_VALUE,
                            make_error);
    }